

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppSimpleOverlay(bool *p_open)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  bool bVar3;
  ImGuiIO_conflict *pIVar4;
  ImGuiViewport *pIVar5;
  float local_5c;
  float local_54;
  float local_50;
  float local_4c;
  ImVec2 local_48;
  ImVec2 window_pos_pivot;
  ImVec2 window_pos;
  ImVec2 work_size;
  ImVec2 work_pos;
  ImGuiViewport *viewport;
  float PAD;
  ImGuiWindowFlags window_flags;
  ImGuiIO_conflict *io;
  bool *p_open_local;
  
  pIVar4 = ImGui::GetIO();
  viewport._4_4_ = 0x2c116b;
  if (ShowExampleAppSimpleOverlay::corner != -1) {
    pIVar5 = ImGui::GetMainViewport();
    IVar1 = pIVar5->WorkPos;
    IVar2 = pIVar5->WorkSize;
    ImVec2::ImVec2(&window_pos_pivot);
    ImVec2::ImVec2(&local_48);
    work_size.x = IVar1.x;
    if ((ShowExampleAppSimpleOverlay::corner & 1U) == 0) {
      local_4c = work_size.x + 10.0;
    }
    else {
      window_pos.x = IVar2.x;
      local_4c = (work_size.x + window_pos.x) - 10.0;
    }
    window_pos_pivot.x = local_4c;
    work_size.y = IVar1.y;
    if ((ShowExampleAppSimpleOverlay::corner & 2U) == 0) {
      local_50 = work_size.y + 10.0;
    }
    else {
      window_pos.y = IVar2.y;
      local_50 = (work_size.y + window_pos.y) - 10.0;
    }
    window_pos_pivot.y = local_50;
    local_54 = 1.0;
    if ((ShowExampleAppSimpleOverlay::corner & 1U) == 0) {
      local_54 = 0.0;
    }
    local_48.x = local_54;
    local_5c = 1.0;
    if ((ShowExampleAppSimpleOverlay::corner & 2U) == 0) {
      local_5c = 0.0;
    }
    local_48.y = local_5c;
    ImGui::SetNextWindowPos(&window_pos_pivot,1,&local_48);
    ImGui::SetNextWindowViewport(pIVar5->ID);
    viewport._4_4_ = 0x2c116f;
  }
  ImGui::SetNextWindowBgAlpha(0.35);
  bVar3 = ImGui::Begin("Example: Simple overlay",p_open,viewport._4_4_);
  if (bVar3) {
    ImGui::Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
    ImGui::Separator();
    bVar3 = ImGui::IsMousePosValid((ImVec2 *)0x0);
    if (bVar3) {
      ImGui::Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar4->MousePos).x,
                  (double)(pIVar4->MousePos).y);
    }
    else {
      ImGui::Text("Mouse Position: <invalid>");
    }
    bVar3 = ImGui::BeginPopupContextWindow((char *)0x0,1);
    if (bVar3) {
      bVar3 = ImGui::MenuItem("Custom",(char *)0x0,ShowExampleAppSimpleOverlay::corner == -1,true);
      if (bVar3) {
        ShowExampleAppSimpleOverlay::corner = -1;
      }
      bVar3 = ImGui::MenuItem("Top-left",(char *)0x0,ShowExampleAppSimpleOverlay::corner == 0,true);
      if (bVar3) {
        ShowExampleAppSimpleOverlay::corner = 0;
      }
      bVar3 = ImGui::MenuItem("Top-right",(char *)0x0,ShowExampleAppSimpleOverlay::corner == 1,true)
      ;
      if (bVar3) {
        ShowExampleAppSimpleOverlay::corner = 1;
      }
      bVar3 = ImGui::MenuItem("Bottom-left",(char *)0x0,ShowExampleAppSimpleOverlay::corner == 2,
                              true);
      if (bVar3) {
        ShowExampleAppSimpleOverlay::corner = 2;
      }
      bVar3 = ImGui::MenuItem("Bottom-right",(char *)0x0,ShowExampleAppSimpleOverlay::corner == 3,
                              true);
      if (bVar3) {
        ShowExampleAppSimpleOverlay::corner = 3;
      }
      if ((p_open != (bool *)0x0) &&
         (bVar3 = ImGui::MenuItem("Close",(char *)0x0,false,true), bVar3)) {
        *p_open = false;
      }
      ImGui::EndPopup();
    }
  }
  ImGui::End();
  return;
}

Assistant:

static void ShowExampleAppSimpleOverlay(bool* p_open)
{
    static int corner = 0;
    ImGuiIO& io = ImGui::GetIO();
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDecoration | ImGuiWindowFlags_NoDocking | ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoNav;
    if (corner != -1)
    {
        const float PAD = 10.0f;
        const ImGuiViewport* viewport = ImGui::GetMainViewport();
        ImVec2 work_pos = viewport->WorkPos; // Use work area to avoid menu-bar/task-bar, if any!
        ImVec2 work_size = viewport->WorkSize;
        ImVec2 window_pos, window_pos_pivot;
        window_pos.x = (corner & 1) ? (work_pos.x + work_size.x - PAD) : (work_pos.x + PAD);
        window_pos.y = (corner & 2) ? (work_pos.y + work_size.y - PAD) : (work_pos.y + PAD);
        window_pos_pivot.x = (corner & 1) ? 1.0f : 0.0f;
        window_pos_pivot.y = (corner & 2) ? 1.0f : 0.0f;
        ImGui::SetNextWindowPos(window_pos, ImGuiCond_Always, window_pos_pivot);
        ImGui::SetNextWindowViewport(viewport->ID);
        window_flags |= ImGuiWindowFlags_NoMove;
    }
    ImGui::SetNextWindowBgAlpha(0.35f); // Transparent background
    if (ImGui::Begin("Example: Simple overlay", p_open, window_flags))
    {
        ImGui::Text("Simple overlay\n" "in the corner of the screen.\n" "(right-click to change position)");
        ImGui::Separator();
        if (ImGui::IsMousePosValid())
            ImGui::Text("Mouse Position: (%.1f,%.1f)", io.MousePos.x, io.MousePos.y);
        else
            ImGui::Text("Mouse Position: <invalid>");
        if (ImGui::BeginPopupContextWindow())
        {
            if (ImGui::MenuItem("Custom",       NULL, corner == -1)) corner = -1;
            if (ImGui::MenuItem("Top-left",     NULL, corner == 0)) corner = 0;
            if (ImGui::MenuItem("Top-right",    NULL, corner == 1)) corner = 1;
            if (ImGui::MenuItem("Bottom-left",  NULL, corner == 2)) corner = 2;
            if (ImGui::MenuItem("Bottom-right", NULL, corner == 3)) corner = 3;
            if (p_open && ImGui::MenuItem("Close")) *p_open = false;
            ImGui::EndPopup();
        }
    }
    ImGui::End();
}